

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_print.c
# Opt level: O3

void h262_print_macroblock(h262_seqparm *seqparm,h262_picparm *picparm,h262_macroblock *mb,int addr)

{
  uint32_t uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  char **ppcVar7;
  long lVar8;
  int32_t (*paiVar9) [64];
  char *__format;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  
  printf("\tMacroblock %d: (%d, %d)\n",(ulong)(uint)addr,
         (ulong)(uint)addr % (ulong)picparm->pic_width_in_mbs,
         (ulong)(uint)addr / (ulong)picparm->pic_width_in_mbs);
  printf("\t\tmacroblock_flags =");
  if (mb->macroblock_skipped != 0) {
    printf(" SKIP");
  }
  if (mb->macroblock_quant != 0) {
    printf(" QUANT");
  }
  if (mb->macroblock_motion_forward != 0) {
    printf(" FWD");
  }
  if (mb->macroblock_motion_backward != 0) {
    printf(" BWD");
  }
  if (mb->macroblock_pattern != 0) {
    printf(" PATTERN");
  }
  if (mb->macroblock_intra != 0) {
    printf(" INTRA");
  }
  putchar(10);
  if (mb->macroblock_intra == 0) {
    bVar13 = picparm->picture_structure != 3;
    ppcVar7 = h262_print_macroblock::fipms;
    if (!bVar13) {
      ppcVar7 = h262_print_macroblock::frpms;
    }
    __format = "\t\tfield_motion_type = %d [%s]\n";
    if (!bVar13) {
      __format = "\t\tframe_motion_type = %d [%s]\n";
    }
    printf(__format,(ulong)*(uint32_t *)
                            ((long)(mb->motion_vertical_field_select + -2) + (ulong)bVar13 * 4),
           ppcVar7[*(uint32_t *)((long)(mb->motion_vertical_field_select + -2) + (ulong)bVar13 * 4)]
          );
    if ((mb->macroblock_intra != 0) || (mb->macroblock_pattern != 0)) goto LAB_00104ad4;
  }
  else {
LAB_00104ad4:
    printf("\t\tdct_type = %d\n",(ulong)mb->dct_type);
  }
  printf("\t\tquantiser_scale_code = %d\n",(ulong)mb->quantiser_scale_code);
  if ((mb->macroblock_intra != 0) || (mb->macroblock_skipped != 0)) goto LAB_00104ce9;
  if (picparm->picture_structure == 3) {
    uVar1 = mb->frame_motion_type;
    if (uVar1 == 1) {
      uVar6 = 2;
LAB_00104b9b:
      bVar3 = true;
      bVar13 = false;
    }
    else {
      if (uVar1 == 3) goto LAB_00104b7c;
      if (uVar1 != 2) goto LAB_00104ce9;
      bVar13 = true;
      uVar6 = 1;
LAB_00104b75:
      bVar3 = true;
    }
  }
  else {
    uVar2 = mb->field_motion_type;
    uVar6 = (ulong)uVar2;
    if (uVar6 == 1) goto LAB_00104b9b;
    if (uVar2 != 3) {
      if (uVar2 != 2) goto LAB_00104ce9;
      uVar6 = 2;
      bVar13 = false;
      goto LAB_00104b75;
    }
LAB_00104b7c:
    bVar13 = true;
    uVar6 = 1;
    bVar3 = false;
  }
  uVar11 = 0;
  do {
    lVar8 = 0;
    bVar5 = true;
    do {
      bVar4 = bVar5;
      if (bVar4) {
        if (mb->macroblock_motion_forward != 0) goto LAB_00104c1f;
      }
      else {
        if (mb->macroblock_motion_backward == 0) break;
LAB_00104c1f:
        if (!bVar13) {
          printf("\t\tmotion_vertical_field_select[%d][%d] = %d\n",uVar11 & 0xffffffff,lVar8,
                 (ulong)mb->motion_vertical_field_select[uVar11][lVar8]);
        }
        lVar10 = 0;
        bVar5 = true;
        do {
          bVar12 = bVar5;
          printf("\t\tmotion_code[%d][%d][%d] = %d\n",uVar11 & 0xffffffff,lVar8,lVar10,
                 (ulong)mb->motion_code[uVar11][lVar8][lVar10]);
          printf("\t\tmotion_residual[%d][%d][%d] = %d\n",uVar11 & 0xffffffff,lVar8,lVar10,
                 (ulong)mb->motion_residual[uVar11][lVar8][lVar10]);
          if (!bVar3) {
            printf("\t\tdmvector[%d] = %d\n",lVar10,(ulong)mb->dmvector[lVar10]);
          }
          lVar10 = 1;
          bVar5 = false;
        } while (bVar12);
      }
      lVar8 = 1;
      bVar5 = false;
    } while (bVar4);
    uVar11 = uVar11 + 1;
  } while (uVar11 != uVar6);
LAB_00104ce9:
  printf("\t\tcoded_block_pattern = 0x%x\n",(ulong)mb->coded_block_pattern);
  paiVar9 = mb->block;
  uVar6 = 0;
  do {
    printf("\t\tBlock %d:",uVar6 & 0xffffffff);
    lVar8 = 0;
    do {
      printf(" %d",(ulong)(uint)(*paiVar9)[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x40);
    putchar(10);
    uVar6 = uVar6 + 1;
    paiVar9 = paiVar9 + 1;
  } while ((long)uVar6 < (long)h262_macroblock::block_count[seqparm->chroma_format]);
  return;
}

Assistant:

void h262_print_macroblock(struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_macroblock *mb, int addr) {
	int i;
	static const int block_count[4] = { 4, 6, 8, 12 };
	static const char *const frpms[] = { "???", "field", "frame", "dual-prime" };
	static const char *const fipms[] = { "???", "field", "16x8", "dual-prime" };
	printf("\tMacroblock %d: (%d, %d)\n", addr, addr % picparm->pic_width_in_mbs, addr / picparm->pic_width_in_mbs);
	printf("\t\tmacroblock_flags =");
	if (mb->macroblock_skipped)
		printf(" SKIP");
	if (mb->macroblock_quant)
		printf(" QUANT");
	if (mb->macroblock_motion_forward)
		printf(" FWD");
	if (mb->macroblock_motion_backward)
		printf(" BWD");
	if (mb->macroblock_pattern)
		printf(" PATTERN");
	if (mb->macroblock_intra)
		printf(" INTRA");
	printf("\n");
	if (!mb->macroblock_intra) {
		if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
			printf("\t\tframe_motion_type = %d [%s]\n", mb->frame_motion_type, frpms[mb->frame_motion_type]);
		} else {
			printf("\t\tfield_motion_type = %d [%s]\n", mb->field_motion_type, fipms[mb->field_motion_type]);
		}
	}
	if (mb->macroblock_intra || mb->macroblock_pattern)
		printf("\t\tdct_type = %d\n", mb->dct_type);
	printf("\t\tquantiser_scale_code = %d\n", mb->quantiser_scale_code);
	if (!mb->macroblock_intra && !mb->macroblock_skipped) {
		int mvc, mfs, dmv;
		if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
			switch (mb->frame_motion_type) {
				case H262_FRAME_MOTION_FIELD:
					mvc = 2;
					mfs = 1;
					dmv = 0;
					break;
				case H262_FRAME_MOTION_FRAME:
					mvc = 1;
					mfs = 0;
					dmv = 0;
					break;
				case H262_FRAME_MOTION_DUAL_PRIME:
					mvc = 1;
					mfs = 0;
					dmv = 1;
					break;
				default:
					mvc = 0;
			}
		} else {
			switch (mb->field_motion_type) {
				case H262_FIELD_MOTION_FIELD:
					mvc = 1;
					mfs = 1;
					dmv = 0;
					break;
				case H262_FIELD_MOTION_16X8:
					mvc = 2;
					mfs = 1;
					dmv = 0;
					break;
				case H262_FIELD_MOTION_DUAL_PRIME:
					mvc = 1;
					mfs = 0;
					dmv = 1;
					break;
				default:
					mvc = 0;
			}
		}
		int r, s, t;
		for (r = 0; r < mvc; r++) {
			for (s = 0; s < 2; s++) {
				if (s == 0 && !mb->macroblock_motion_forward)
					continue;
				if (s == 1 && !mb->macroblock_motion_backward)
					continue;
				if (mfs)
					printf("\t\tmotion_vertical_field_select[%d][%d] = %d\n", r, s, mb->motion_vertical_field_select[r][s]);
				for (t = 0; t < 2; t++) {
					printf("\t\tmotion_code[%d][%d][%d] = %d\n", r, s, t, mb->motion_code[r][s][t]);
					printf("\t\tmotion_residual[%d][%d][%d] = %d\n", r, s, t, mb->motion_residual[r][s][t]);
					if (dmv)
						printf("\t\tdmvector[%d] = %d\n", t, mb->dmvector[t]);
				}
			}
		}
	}
	printf("\t\tcoded_block_pattern = 0x%x\n", mb->coded_block_pattern);
	for (i = 0; i < block_count[seqparm->chroma_format]; i++) {
		printf("\t\tBlock %d:", i);
		int j;
		for (j = 0; j < 64; j++)
			printf(" %d", mb->block[i][j]);
		printf("\n");
	}
}